

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManTransferMapping(Gia_Man_t *p,Gia_Man_t *pGia)

{
  int iVar1;
  int Entry;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int local_84;
  int local_28;
  int iFan;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManHasMapping(pGia);
  if (iVar1 != 0) {
    Gia_ManMappingVerify(pGia);
    Vec_IntFreeP(&p->vMapping);
    iVar1 = Gia_ManObjNum(p);
    pVVar2 = Vec_IntAlloc(iVar1 << 1);
    p->vMapping = pVVar2;
    pVVar2 = p->vMapping;
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFill(pVVar2,iVar1,0);
    for (iFan = 1; iVar1 = Gia_ManObjNum(pGia), iFan < iVar1; iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut(pGia,iFan);
      if (iVar1 != 0) {
        pGVar3 = Gia_ManObj(pGia,iFan);
        iVar1 = Gia_ObjValue(pGVar3);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 != 0) {
          __assert_fail("!Abc_LitIsCompl(Gia_ObjValue(Gia_ManObj(pGia, i)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x7ea,"void Gia_ManTransferMapping(Gia_Man_t *, Gia_Man_t *)");
        }
        pGVar3 = Gia_ManObj(pGia,iFan);
        iVar1 = Gia_ObjValue(pGVar3);
        iVar1 = Abc_Lit2Var(iVar1);
        pGVar3 = Gia_ManObj(p,iVar1);
        pVVar2 = p->vMapping;
        iVar1 = Gia_ObjId(p,pGVar3);
        Entry = Vec_IntSize(p->vMapping);
        Vec_IntWriteEntry(pVVar2,iVar1,Entry);
        pVVar2 = p->vMapping;
        iVar1 = Gia_ObjLutSize(pGia,iFan);
        Vec_IntPush(pVVar2,iVar1);
        for (local_28 = 0; iVar1 = Gia_ObjLutSize(pGia,iFan), local_28 < iVar1;
            local_28 = local_28 + 1) {
          piVar4 = Gia_ObjLutFanins(pGia,iFan);
          pVVar2 = p->vMapping;
          pGVar3 = Gia_ManObj(pGia,piVar4[local_28]);
          iVar1 = Gia_ObjValue(pGVar3);
          iVar1 = Abc_Lit2Var(iVar1);
          Vec_IntPush(pVVar2,iVar1);
        }
        iVar1 = Gia_ObjLutMuxId(pGia,iFan);
        iVar1 = Abc_AbsInt(iVar1);
        pGVar3 = Gia_ManObj(pGia,iVar1);
        iVar1 = Gia_ObjValue(pGVar3);
        local_84 = Abc_Lit2Var(iVar1);
        pVVar2 = p->vMapping;
        iVar1 = Gia_ObjLutIsMux(pGia,iFan);
        if (iVar1 != 0) {
          local_84 = -local_84;
        }
        Vec_IntPush(pVVar2,local_84);
      }
    }
    Gia_ManMappingVerify(p);
  }
  return;
}

Assistant:

void Gia_ManTransferMapping( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( !Gia_ManHasMapping(pGia) )
        return;
    Gia_ManMappingVerify( pGia );
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntAlloc( 2 * Gia_ManObjNum(p) );
    Vec_IntFill( p->vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( pGia, i )
    {
        assert( !Abc_LitIsCompl(Gia_ObjValue(Gia_ManObj(pGia, i))) );
        pObj = Gia_ManObj( p, Abc_Lit2Var(Gia_ObjValue(Gia_ManObj(pGia, i))) );
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Gia_ObjLutSize(pGia, i) );
        Gia_LutForEachFanin( pGia, i, iFan, k )
            Vec_IntPush( p->vMapping, Abc_Lit2Var(Gia_ObjValue(Gia_ManObj(pGia, iFan))) );
        iFan = Abc_Lit2Var( Gia_ObjValue(Gia_ManObj(pGia, Abc_AbsInt(Gia_ObjLutMuxId(pGia, i)))) );
        Vec_IntPush( p->vMapping, Gia_ObjLutIsMux(pGia, i) ? -iFan : iFan );
    }
    Gia_ManMappingVerify( p );
}